

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this,int len,char *s)

{
  size_t sVar1;
  uchar *puVar2;
  char *s_local;
  int len_local;
  String *this_local;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    (this->super_tagbstring).slen = (int)sVar1;
    (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
    if ((this->super_tagbstring).mlen < len) {
      (this->super_tagbstring).mlen = len;
    }
    puVar2 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar2;
    if ((this->super_tagbstring).data == (uchar *)0x0) {
      (this->super_tagbstring).slen = 0;
      (this->super_tagbstring).mlen = 0;
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x98,"Failure in (int len, char *) constructor");
    }
    memcpy((this->super_tagbstring).data,s,(long)((this->super_tagbstring).slen + 1));
  }
  return;
}

Assistant:

String::String(int len, const char *s)
    {
        slen = mlen = 0; data = 0;
        if (s)
        {
            slen = (int)strlen(s);
            mlen = slen + 1;
            if (mlen < len)
                mlen = len;

            data = (uint8 * ) malloc(mlen);
            if (!data)
            {
                mlen = slen = 0;
                bstringThrow("Failure in (int len, char *) constructor");
            }
            memcpy(data, s, slen + 1);
        }
    }